

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  ZeroCopyInputStream *pZVar4;
  int *piVar5;
  DiskSourceTree *this_00;
  long lVar6;
  ulong uVar7;
  ZeroCopyInputStream *local_b0;
  string *local_a0;
  string temp_disk_file;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)virtual_file);
  CanonicalizePath(&temp_disk_file,&local_70);
  bVar2 = std::operator!=(virtual_file,&temp_disk_file);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&temp_disk_file);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar2 = ContainsParentReference(virtual_file);
    std::__cxx11::string::~string((string *)&temp_disk_file);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) {
      uVar7 = 0xffffffffffffffff;
      lVar6 = 0x20;
      while( true ) {
        local_a0 = &this->last_error_message_;
        pMVar1 = (this->mappings_).
                 super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar7 + 1;
        if ((ulong)((long)(this->mappings_).
                          super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 6) <= uVar7)
        break;
        temp_disk_file._M_dataplus._M_p = (pointer)&temp_disk_file.field_2;
        temp_disk_file._M_string_length = 0;
        temp_disk_file.field_2._M_local_buf[0] = '\0';
        this_00 = (DiskSourceTree *)virtual_file;
        bVar3 = ApplyMapping(virtual_file,(string *)((long)pMVar1 + lVar6 + -0x20),
                             (string *)((long)&(pMVar1->virtual_path)._M_dataplus._M_p + lVar6),
                             &temp_disk_file);
        bVar2 = true;
        if (bVar3) {
          pZVar4 = OpenDiskFile(this_00,&temp_disk_file);
          if (pZVar4 == (ZeroCopyInputStream *)0x0) {
            piVar5 = __errno_location();
            if (*piVar5 == 0xd) {
              std::operator+(&local_50,"Read access is denied for file: ",&temp_disk_file);
              std::__cxx11::string::operator=((string *)local_a0,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              bVar2 = false;
              local_b0 = (ZeroCopyInputStream *)0x0;
            }
          }
          else {
            if (disk_file != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)disk_file);
            }
            bVar2 = false;
            local_b0 = pZVar4;
          }
        }
        lVar6 = lVar6 + 0x40;
        std::__cxx11::string::~string((string *)&temp_disk_file);
        if (!bVar2) {
          return local_b0;
        }
      }
    }
  }
  std::__cxx11::string::assign((char *)&this->last_error_message_);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const string& virtual_file,
    string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ = "Backslashes, consecutive slashes, \".\", or \"..\" "
                          "are not allowed in the virtual path";
    return NULL;
  }

  for (int i = 0; i < mappings_.size(); i++) {
    string temp_disk_file;
    if (ApplyMapping(virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ = "Read access is denied for file: " +
                              temp_disk_file;
        return NULL;
      }
    }
  }
  last_error_message_ = "File not found.";
  return NULL;
}